

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int reglevel(FuncState *fs,int nvar)

{
  Vardesc *pVVar1;
  long lVar2;
  
  do {
    if (nvar < 1) {
      return 0;
    }
    nvar = nvar + -1;
    pVVar1 = (fs->ls->dyd->actvar).arr;
    lVar2 = (long)(fs->firstlocal + nvar);
  } while (*(char *)((long)pVVar1 + lVar2 * 0x18 + 9) == '\x03');
  return (&pVVar1->vd)[lVar2].ridx + 1;
}

Assistant:

static int reglevel (FuncState *fs, int nvar) {
  while (nvar-- > 0) {
    Vardesc *vd = getlocalvardesc(fs, nvar);  /* get previous variable */
    if (vd->vd.kind != RDKCTC)  /* is in a register? */
      return vd->vd.ridx + 1;
  }
  return 0;  /* no variables in registers */
}